

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stats.h
# Opt level: O2

bool TestDistribution<unsigned_long>
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *hashes,bool drawDiagram)

{
  pointer puVar1;
  uint32_t uVar2;
  uint count;
  uint uVar3;
  uint bincount;
  long lVar4;
  uint uVar5;
  size_t j;
  ulong uVar6;
  undefined7 in_register_00000031;
  ulong uVar7;
  int start;
  uint start_00;
  ulong uVar8;
  undefined1 auVar9 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [16];
  double local_68;
  vector<int,_std::allocator<int>_> bins;
  undefined1 extraout_var [56];
  
  auVar9 = in_ZMM0._0_16_;
  printf("Testing distribution - ");
  if ((int)CONCAT71(in_register_00000031,drawDiagram) != 0) {
    putchar(10);
  }
  auVar9 = vcvtusi2sd_avx512f(auVar9,(long)(hashes->
                                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                           )._M_impl.super__Vector_impl_data._M_finish -
                                     (long)(hashes->
                                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                           )._M_impl.super__Vector_impl_data._M_start >> 3);
  count = 0x15;
  do {
    count = count - 1;
    uVar3 = 1 << (count & 0x1f);
  } while (auVar9._0_8_ / (double)(int)uVar3 < 5.0);
  bins.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  bins.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  bins.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::resize(&bins,(long)(int)uVar3);
  start_00 = 0;
  uVar8 = 0xffffffffffffffff;
  uVar7 = 0xffffffff;
  local_68 = 0.0;
  do {
    if (start_00 == 0x40) {
      printf("Worst bias is the %2d-bit window at bit %2d - %.3f%%",uVar7,uVar8 & 0xffffffff);
      if (1.0 <= local_68 * 100.0) {
        puts(" !!!!!");
      }
      else {
        putchar(10);
      }
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&bins.super__Vector_base<int,_std::allocator<int>_>);
      return local_68 * 100.0 < 1.0;
    }
    memset(bins.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start,0,(long)(int)uVar3 << 2);
    lVar4 = 0;
    for (uVar6 = 0;
        puVar1 = (hashes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                 .super__Vector_impl_data._M_start,
        uVar6 < (ulong)((long)(hashes->
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                              _M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3);
        uVar6 = uVar6 + 1) {
      uVar2 = window32((void *)((long)puVar1 + lVar4),8,start_00,count);
      lVar4 = lVar4 + 8;
      bins.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      [uVar2] = bins.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start[uVar2] + 1;
    }
    bincount = uVar3;
    uVar5 = count;
    if (drawDiagram) {
      putchar(0x5b);
    }
    while (0xff < (int)bincount) {
      auVar10._0_8_ =
           calcScore(bins.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start,bincount,
                     (int)((ulong)((long)(hashes->
                                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                         )._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(hashes->
                                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                        )._M_impl.super__Vector_impl_data._M_start) >> 3));
      auVar10._8_56_ = extraout_var;
      auVar9 = auVar10._0_16_;
      if (drawDiagram) {
        plot(auVar10._0_8_);
        auVar9._8_8_ = 0;
        auVar9._0_8_ = auVar10._0_8_;
      }
      auVar11._8_8_ = 0;
      auVar11._0_8_ = local_68;
      auVar11 = vmaxsd_avx(auVar9,auVar11);
      uVar8 = uVar8 & 0xffffffff;
      if (local_68 < auVar9._0_8_) {
        uVar8 = (ulong)start_00;
        uVar7 = (ulong)uVar5;
      }
      local_68 = auVar11._0_8_;
      if ((int)uVar5 < 9) break;
      bincount = bincount >> 1;
      uVar5 = uVar5 - 1;
      for (uVar6 = 0; bincount != uVar6; uVar6 = uVar6 + 1) {
        bins.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
        [uVar6] = bins.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                  ._M_start[uVar6] +
                  bins.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                  ._M_start[bincount + uVar6];
      }
    }
    if (drawDiagram) {
      puts("]");
    }
    start_00 = start_00 + 1;
  } while( true );
}

Assistant:

bool TestDistribution ( std::vector<hashtype> & hashes, bool drawDiagram )
{
  printf("Testing distribution - ");

  if(drawDiagram) printf("\n");

  const int hashbits = sizeof(hashtype) * 8;

  int maxwidth = 20;

  // We need at least 5 keys per bin to reliably test distribution biases
  // down to 1%, so don't bother to test sparser distributions than that

  while(double(hashes.size()) / double(1 << maxwidth) < 5.0)
  {
    maxwidth--;
  }

  std::vector<int> bins;
  bins.resize(1 << maxwidth);

  double worst = 0;
  int worstStart = -1;
  int worstWidth = -1;

  for(int start = 0; start < hashbits; start++)
  {
    int width = maxwidth;
    int bincount = (1 << width);

    memset(&bins[0],0,sizeof(int)*bincount);

    for(size_t j = 0; j < hashes.size(); j++)
    {
      hashtype & hash = hashes[j];

      uint32_t index = window(&hash,sizeof(hash),start,width);

      bins[index]++;
    }

    // Test the distribution, then fold the bins in half,
    // repeat until we're down to 256 bins

    if(drawDiagram) printf("[");

    while(bincount >= 256)
    {
      double n = calcScore(&bins[0],bincount,(int)hashes.size());

      if(drawDiagram) plot(n);

      if(n > worst)
      {
        worst = n;
        worstStart = start;
        worstWidth = width;
      }

      width--;
      bincount /= 2;

      if(width < 8) break;

      for(int i = 0; i < bincount; i++)
      {
        bins[i] += bins[i+bincount];
      }
    }

    if(drawDiagram) printf("]\n");
  }

  double pct = worst * 100.0;

  printf("Worst bias is the %2d-bit window at bit %2d - %.3f%%",
         worstWidth, worstStart, pct);
  if(pct >= 1.0) {
    printf(" !!!!!\n");
    return false;
  }
  else {
    printf("\n");
    return true;
  }
}